

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O3

void __thiscall cppcms::impl::cgi::http::async_read_eof(http *this,callback *h)

{
  _Atomic_word *p_Var1;
  element_type *peVar2;
  pointer_type pVar3;
  int iVar4;
  ignore_binder cb;
  mutable_buffer tmp;
  callback local_78;
  callback<void_(const_std::error_code_&,_unsigned_long)> local_70;
  intrusive_ptr<booster::callable<void_()>_> local_68;
  weak_ptr<cppcms::impl::cgi::http> local_60;
  int local_50;
  element_type *local_48;
  pointer local_38;
  page *ppStack_30;
  pointer local_28;
  
  peVar2 = (this->watchdog_).
           super___shared_ptr<cppcms::impl::cgi::http_watchdog,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  self((http *)&stack0xffffffffffffffb0);
  local_60.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48;
  if (local_48 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)
               ((long)&(local_48->super_enable_shared_from_this<cppcms::impl::cgi::connection>).
                       _M_weak_this.
                       super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + 4);
      *p_Var1 = *p_Var1 + 1;
      UNLOCK();
    }
    else {
      p_Var1 = (_Atomic_word *)
               ((long)&(local_48->super_enable_shared_from_this<cppcms::impl::cgi::connection>).
                       _M_weak_this.
                       super___weak_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr + 4);
      *p_Var1 = *p_Var1 + 1;
    }
  }
  std::
  _Rb_tree<std::weak_ptr<cppcms::impl::cgi::http>,std::weak_ptr<cppcms::impl::cgi::http>,std::_Identity<std::weak_ptr<cppcms::impl::cgi::http>>,std::owner_less<std::weak_ptr<cppcms::impl::cgi::http>>,std::allocator<std::weak_ptr<cppcms::impl::cgi::http>>>
  ::_M_insert_unique<std::weak_ptr<cppcms::impl::cgi::http>const&>
            ((_Rb_tree<std::weak_ptr<cppcms::impl::cgi::http>,std::weak_ptr<cppcms::impl::cgi::http>,std::_Identity<std::weak_ptr<cppcms::impl::cgi::http>>,std::owner_less<std::weak_ptr<cppcms::impl::cgi::http>>,std::allocator<std::weak_ptr<cppcms::impl::cgi::http>>>
              *)&peVar2->connections_,&local_60);
  if ((element_type *)
      local_60.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_60.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = (local_60.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_60.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*(local_60.super___weak_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if (local_48 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
  }
  pVar3.p_ = (h->call_ptr).p_;
  local_68.p_ = pVar3.p_;
  if (pVar3.p_ != (callable<void_()> *)0x0) {
    booster::atomic_counter::inc();
  }
  local_50 = 0;
  local_38 = (pointer)0x0;
  ppStack_30 = (page *)0x0;
  local_28 = (pointer)0x0;
  booster::aio::buffer_impl<char_*>::add
            ((buffer_impl<char_*> *)&stack0xffffffffffffffb0,&async_read_eof::a,1);
  local_78.call_ptr.p_ = (pointer_type)(pointer_type)pVar3.p_;
  if (pVar3.p_ != (callable<void_()> *)0x0) {
    booster::atomic_counter::inc();
  }
  booster::callback<void_(const_std::error_code_&,_unsigned_long)>::
  callback<cppcms::impl::cgi::http::ignore_binder>(&local_70,(ignore_binder *)&local_78);
  booster::aio::stream_socket::async_read_some
            ((mutable_buffer *)&this->socket_,(callback *)&stack0xffffffffffffffb0);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  ~intrusive_ptr(&local_70.call_ptr);
  booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&local_78.call_ptr);
  if (local_38 != (pointer)0x0) {
    operator_delete(local_38);
  }
  booster::intrusive_ptr<booster::callable<void_()>_>::~intrusive_ptr(&local_68);
  return;
}

Assistant:

virtual void async_read_eof(callback const &h)
		{
			watchdog_->add(self());
			static char a;
			ignore_binder cb = { h };
			socket_.async_read_some(io::buffer(&a,1),cb);
		}